

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O2

void __thiscall ChaCha20Aligned::Keystream(ChaCha20Aligned *this,Span<std::byte> output)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint32_t x;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint32_t uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  long in_FS_OFFSET;
  uint local_118;
  byte *local_e0;
  ulong local_d8;
  
  local_e0 = output.m_data;
  lVar9 = *(long *)(in_FS_OFFSET + 0x28);
  if (((undefined1  [16])output & (undefined1  [16])0x3f) != (undefined1  [16])0x0) {
    __assert_fail("blocks * BLOCKLEN == output.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x40,"void ChaCha20Aligned::Keystream(Span<std::byte>)");
  }
  if (0x3f < output.m_size) {
    local_d8 = output.m_size >> 6;
    uVar1 = this->input[0];
    uVar2 = this->input[2];
    uVar3 = this->input[3];
    uVar4 = this->input[6];
    uVar5 = this->input[7];
    uVar6 = this->input[10];
    uVar12 = uVar2 + 0x79622d32 ^ uVar6;
    uVar13 = uVar12 << 0x10 | uVar12 >> 0x10;
    uVar12 = this->input[0xb];
    uVar20 = uVar4 + uVar13;
    uVar34 = uVar20 ^ uVar2;
    uVar34 = uVar34 << 0xc | uVar34 >> 0x14;
    uVar38 = uVar34 + uVar2 + 0x79622d32;
    uVar13 = uVar13 ^ uVar38;
    uVar14 = uVar13 << 8 | uVar13 >> 0x18;
    uVar20 = uVar20 + uVar14;
    uVar34 = uVar34 ^ uVar20;
    uVar35 = uVar34 << 7 | uVar34 >> 0x19;
    uVar13 = uVar3 + 0x6b206574 ^ uVar12;
    uVar13 = uVar13 << 0x10 | uVar13 >> 0x10;
    uVar21 = uVar13 + uVar5;
    uVar34 = uVar21 ^ uVar3;
    uVar25 = uVar34 << 0xc | uVar34 >> 0x14;
    uVar27 = uVar25 + uVar3 + 0x6b206574;
    uVar13 = uVar13 ^ uVar27;
    uVar34 = uVar13 << 8 | uVar13 >> 0x18;
    uVar21 = uVar21 + uVar34;
    uVar25 = uVar25 ^ uVar21;
    uVar25 = uVar25 << 7 | uVar25 >> 0x19;
    uVar38 = uVar38 + uVar25;
    uVar13 = this->input[1];
    uVar7 = this->input[4];
    uVar8 = this->input[5];
    local_118 = this->input[8];
    uVar37 = this->input[9];
    while( true ) {
      local_d8 = local_d8 - 1;
      uVar22 = local_118 ^ uVar1 + 0x61707865;
      uVar23 = uVar22 << 0x10 | uVar22 >> 0x10;
      uVar11 = uVar23 + uVar7;
      uVar22 = uVar11 ^ uVar1;
      uVar22 = uVar22 << 0xc | uVar22 >> 0x14;
      uVar17 = uVar22 + uVar1 + 0x61707865;
      uVar23 = uVar23 ^ uVar17;
      uVar24 = uVar23 << 8 | uVar23 >> 0x18;
      uVar11 = uVar11 + uVar24;
      uVar22 = uVar22 ^ uVar11;
      uVar10 = uVar22 << 7 | uVar22 >> 0x19;
      uVar22 = uVar37 ^ uVar13 + 0x3320646e;
      uVar18 = uVar22 << 0x10 | uVar22 >> 0x10;
      uVar36 = uVar18 + uVar8;
      uVar22 = uVar36 ^ uVar13;
      uVar22 = uVar22 << 0xc | uVar22 >> 0x14;
      uVar23 = uVar13 + 0x3320646e + uVar22;
      uVar18 = uVar18 ^ uVar23;
      uVar19 = uVar18 << 8 | uVar18 >> 0x18;
      uVar36 = uVar36 + uVar19;
      uVar22 = uVar22 ^ uVar36;
      uVar18 = uVar22 << 7 | uVar22 >> 0x19;
      uVar17 = uVar17 + uVar18;
      uVar22 = uVar17 ^ uVar34;
      uVar22 = uVar22 << 0x10 | uVar22 >> 0x10;
      uVar39 = uVar22 + uVar20;
      uVar18 = uVar18 ^ uVar39;
      uVar15 = uVar18 << 0xc | uVar18 >> 0x14;
      uVar17 = uVar17 + uVar15;
      uVar22 = uVar22 ^ uVar17;
      uVar18 = uVar22 << 8 | uVar22 >> 0x18;
      uVar39 = uVar39 + uVar18;
      uVar15 = uVar15 ^ uVar39;
      uVar16 = uVar15 << 7 | uVar15 >> 0x19;
      uVar23 = uVar23 + uVar35;
      uVar24 = uVar24 ^ uVar23;
      uVar22 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar22 + uVar21;
      uVar15 = uVar31 ^ uVar35;
      uVar15 = uVar15 << 0xc | uVar15 >> 0x14;
      uVar23 = uVar23 + uVar15;
      uVar22 = uVar22 ^ uVar23;
      uVar24 = uVar22 << 8 | uVar22 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar15 = uVar15 ^ uVar31;
      uVar26 = uVar15 << 7 | uVar15 >> 0x19;
      uVar19 = uVar19 ^ uVar38;
      uVar15 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar11 = uVar11 + uVar15;
      uVar22 = uVar11 ^ uVar25;
      uVar28 = uVar22 << 0xc | uVar22 >> 0x14;
      uVar22 = uVar38 + uVar28;
      uVar15 = uVar15 ^ uVar22;
      uVar19 = uVar15 << 8 | uVar15 >> 0x18;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar33 = uVar10 + uVar27;
      uVar15 = uVar33 ^ uVar14;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar33 = uVar33 + uVar28;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar31 = uVar31 + uVar18;
      uVar28 = uVar28 ^ uVar31;
      uVar28 = uVar28 << 7 | uVar28 >> 0x19;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar23 = uVar23 + uVar26;
      uVar24 = uVar24 ^ uVar23;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar31 = uVar31 + uVar24;
      uVar26 = uVar26 ^ uVar31;
      uVar26 = uVar26 << 7 | uVar26 >> 0x19;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar28 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar11 = uVar11 + uVar19;
      uVar28 = uVar28 ^ uVar11;
      uVar29 = uVar28 << 7 | uVar28 >> 0x19;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar36 = uVar36 + uVar15;
      uVar10 = uVar10 ^ uVar36;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar11 = uVar11 + uVar24;
      uVar10 = uVar10 ^ uVar11;
      uVar10 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar17 = uVar17 + uVar10;
      uVar24 = uVar24 ^ uVar17;
      uVar24 = uVar24 << 8 | uVar24 >> 0x18;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar23 = uVar23 + uVar16;
      uVar19 = uVar19 ^ uVar23;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar36 = uVar36 + uVar19;
      uVar16 = uVar16 ^ uVar36;
      uVar16 = uVar16 << 7 | uVar16 >> 0x19;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar26 = uVar26 << 0xc | uVar26 >> 0x14;
      uVar22 = uVar22 + uVar26;
      uVar15 = uVar15 ^ uVar22;
      uVar15 = uVar15 << 8 | uVar15 >> 0x18;
      uVar39 = uVar39 + uVar15;
      uVar26 = uVar26 ^ uVar39;
      uVar28 = uVar26 << 7 | uVar26 >> 0x19;
      uVar33 = uVar33 + uVar29;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar31 = uVar31 + uVar18;
      uVar29 = uVar29 ^ uVar31;
      uVar30 = uVar29 << 0xc | uVar29 >> 0x14;
      uVar33 = uVar33 + uVar30;
      uVar18 = uVar18 ^ uVar33;
      uVar18 = uVar18 << 8 | uVar18 >> 0x18;
      uVar11 = uVar11 + uVar24;
      uVar31 = uVar31 + uVar18;
      uVar30 = uVar30 ^ uVar31;
      uVar17 = uVar17 + uVar16;
      uVar18 = uVar18 ^ uVar17;
      uVar18 = uVar18 << 0x10 | uVar18 >> 0x10;
      uVar39 = uVar39 + uVar18;
      uVar16 = uVar16 ^ uVar39;
      uVar26 = uVar16 << 0xc | uVar16 >> 0x14;
      uVar23 = uVar23 + uVar28;
      uVar24 = uVar24 ^ uVar23;
      uVar16 = uVar24 << 0x10 | uVar24 >> 0x10;
      uVar31 = uVar31 + uVar16;
      uVar28 = uVar28 ^ uVar31;
      uVar29 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar18 = uVar17 + uVar26 ^ uVar18;
      uVar16 = uVar29 + uVar23 ^ uVar16;
      uVar10 = uVar10 ^ uVar11;
      uVar28 = uVar30 << 7 | uVar30 >> 0x19;
      uVar22 = uVar22 + uVar28;
      uVar19 = uVar19 ^ uVar22;
      uVar24 = uVar19 << 0x10 | uVar19 >> 0x10;
      uVar11 = uVar11 + uVar24;
      uVar28 = uVar28 ^ uVar11;
      uVar30 = uVar28 << 0xc | uVar28 >> 0x14;
      uVar24 = uVar22 + uVar30 ^ uVar24;
      uVar10 = uVar10 << 7 | uVar10 >> 0x19;
      uVar33 = uVar33 + uVar10;
      uVar15 = uVar15 ^ uVar33;
      uVar19 = uVar15 << 0x10 | uVar15 >> 0x10;
      uVar36 = uVar36 + uVar19;
      uVar10 = uVar10 ^ uVar36;
      uVar15 = uVar10 << 0xc | uVar10 >> 0x14;
      uVar19 = uVar15 + uVar33 ^ uVar19;
      uVar10 = uVar18 << 8 | uVar18 >> 0x18;
      uVar39 = uVar39 + uVar10;
      uVar40 = uVar39 ^ uVar26;
      uVar18 = uVar16 << 8 | uVar16 >> 0x18;
      uVar31 = uVar31 + uVar18;
      uVar16 = uVar31 ^ uVar29;
      uVar28 = uVar24 << 8 | uVar24 >> 0x18;
      uVar11 = uVar11 + uVar28;
      uVar24 = uVar11 ^ uVar30;
      uVar19 = uVar19 << 8 | uVar19 >> 0x18;
      uVar36 = uVar36 + uVar19;
      uVar32 = uVar36 ^ uVar15;
      x = uVar28 + uVar37;
      uVar37 = (local_118 == 0xffffffff) + uVar37;
      WriteLE32(local_e0,uVar26 + uVar17 + 0x61707865);
      WriteLE32(local_e0 + 4,uVar29 + uVar23 + 0x3320646e);
      WriteLE32(local_e0 + 8,uVar22 + uVar30 + 0x79622d32);
      WriteLE32(local_e0 + 0xc,uVar15 + uVar33 + 0x6b206574);
      WriteLE32(local_e0 + 0x10,(uVar32 << 7 | uVar32 >> 0x19) + uVar1);
      WriteLE32(local_e0 + 0x14,(uVar40 << 7 | uVar40 >> 0x19) + uVar13);
      WriteLE32(local_e0 + 0x18,(uVar16 << 7 | uVar16 >> 0x19) + uVar2);
      WriteLE32(local_e0 + 0x1c,(uVar24 << 7 | uVar24 >> 0x19) + uVar3);
      WriteLE32(local_e0 + 0x20,uVar11 + uVar7);
      WriteLE32(local_e0 + 0x24,uVar36 + uVar8);
      WriteLE32(local_e0 + 0x28,uVar39 + uVar4);
      WriteLE32(local_e0 + 0x2c,uVar31 + uVar5);
      WriteLE32(local_e0 + 0x30,uVar18 + local_118);
      WriteLE32(local_e0 + 0x34,x);
      WriteLE32(local_e0 + 0x38,uVar19 + uVar6);
      WriteLE32(local_e0 + 0x3c,uVar10 + uVar12);
      if (local_d8 == 0) break;
      local_e0 = local_e0 + 0x40;
      local_118 = local_118 + 1;
    }
    this->input[8] = local_118 + 1;
    this->input[9] = uVar37;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar9) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void ChaCha20Aligned::Keystream(Span<std::byte> output) noexcept
{
    unsigned char* c = UCharCast(output.data());
    size_t blocks = output.size() / BLOCKLEN;
    assert(blocks * BLOCKLEN == output.size());

    uint32_t x0, x1, x2, x3, x4, x5, x6, x7, x8, x9, x10, x11, x12, x13, x14, x15;
    uint32_t j4, j5, j6, j7, j8, j9, j10, j11, j12, j13, j14, j15;

    if (!blocks) return;

    j4 = input[0];
    j5 = input[1];
    j6 = input[2];
    j7 = input[3];
    j8 = input[4];
    j9 = input[5];
    j10 = input[6];
    j11 = input[7];
    j12 = input[8];
    j13 = input[9];
    j14 = input[10];
    j15 = input[11];

    for (;;) {
        x0 = 0x61707865;
        x1 = 0x3320646e;
        x2 = 0x79622d32;
        x3 = 0x6b206574;
        x4 = j4;
        x5 = j5;
        x6 = j6;
        x7 = j7;
        x8 = j8;
        x9 = j9;
        x10 = j10;
        x11 = j11;
        x12 = j12;
        x13 = j13;
        x14 = j14;
        x15 = j15;

        // The 20 inner ChaCha20 rounds are unrolled here for performance.
        REPEAT10(
            QUARTERROUND( x0, x4, x8,x12);
            QUARTERROUND( x1, x5, x9,x13);
            QUARTERROUND( x2, x6,x10,x14);
            QUARTERROUND( x3, x7,x11,x15);
            QUARTERROUND( x0, x5,x10,x15);
            QUARTERROUND( x1, x6,x11,x12);
            QUARTERROUND( x2, x7, x8,x13);
            QUARTERROUND( x3, x4, x9,x14);
        );

        x0 += 0x61707865;
        x1 += 0x3320646e;
        x2 += 0x79622d32;
        x3 += 0x6b206574;
        x4 += j4;
        x5 += j5;
        x6 += j6;
        x7 += j7;
        x8 += j8;
        x9 += j9;
        x10 += j10;
        x11 += j11;
        x12 += j12;
        x13 += j13;
        x14 += j14;
        x15 += j15;

        ++j12;
        if (!j12) ++j13;

        WriteLE32(c + 0, x0);
        WriteLE32(c + 4, x1);
        WriteLE32(c + 8, x2);
        WriteLE32(c + 12, x3);
        WriteLE32(c + 16, x4);
        WriteLE32(c + 20, x5);
        WriteLE32(c + 24, x6);
        WriteLE32(c + 28, x7);
        WriteLE32(c + 32, x8);
        WriteLE32(c + 36, x9);
        WriteLE32(c + 40, x10);
        WriteLE32(c + 44, x11);
        WriteLE32(c + 48, x12);
        WriteLE32(c + 52, x13);
        WriteLE32(c + 56, x14);
        WriteLE32(c + 60, x15);

        if (blocks == 1) {
            input[8] = j12;
            input[9] = j13;
            return;
        }
        blocks -= 1;
        c += BLOCKLEN;
    }
}